

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test::
~ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test
          (ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  
  (this->super_ZLIBBufferCompressorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ZLIBBufferCompressorTest_002a3068;
  puVar2 = (this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_different_size_buffers_buffer)
{
    for (size_t i = 0; i < 256; i++)
    {
        std::vector<unsigned char> buffer;
        for (unsigned char j = 0; j < i; j++)
        {
            buffer.emplace_back(j);
        }
        TestCompression(buffer, 65536);
        TestCompression(buffer, 8);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
    }
}